

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_symbols.cxx
# Opt level: O3

void draw_filesaveas(Fl_Color c)

{
  Fl_Color FVar1;
  
  draw_filesave(c);
  FVar1 = fl_color_average(c,0xff,0.25);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,(ulong)FVar1);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1b])();
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])
            (0x3fe3333333333333,0xbfe999999999999a);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])
            (0x3ff0000000000000,0xbfd999999999999a);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])(0,0x3fe3333333333333);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])
            (0xbfd999999999999a,0x3fe3333333333333);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])
            (0xbfd999999999999a,0x3fc999999999999a);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x25])();
  FVar1 = fl_color_average(c,0x38,0.67);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,(ulong)FVar1);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1a])();
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])
            (0x3fe3333333333333,0xbfe999999999999a);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])
            (0x3ff0000000000000,0xbfd999999999999a);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])(0,0x3fe3333333333333);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])
            (0xbfd999999999999a,0x3fe3333333333333);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])
            (0xbfd999999999999a,0x3fc999999999999a);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x24])();
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1b])();
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])
            (0xbfb999999999999a,0x3fe3333333333333);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])
            (0xbfd999999999999a,0x3fe3333333333333);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])
            (0xbfd999999999999a,0x3fd3333333333333);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x25])();
  return;
}

Assistant:

static void draw_filesaveas(Fl_Color c) {
  draw_filesave(c);

  fl_color(fl_color_average(c, FL_WHITE, 0.25f));
  BP;
    vv(0.6, -0.8);
    vv(1.0, -0.4);
    vv(0.0, 0.6);
    vv(-0.4, 0.6);
    vv(-0.4, 0.2);
  EP;

  fl_color(fl_darker(c));
  BC;
    vv(0.6, -0.8);
    vv(1.0, -0.4);
    vv(0.0, 0.6);
    vv(-0.4, 0.6);
    vv(-0.4, 0.2);
  EC;

  BP;
    vv(-0.1, 0.6);
    vv(-0.4, 0.6);
    vv(-0.4, 0.3);
  EP;
}